

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFunctionName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Module *pMVar1;
  bool bVar2;
  reference ppFVar3;
  string_view name_00;
  Binding local_b0;
  BinaryReaderIR *local_88;
  char *local_80;
  string local_78;
  undefined1 local_58 [8];
  string dollar_name;
  Func *func;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderIR *)name.data_;
  bVar2 = string_view::empty((string_view *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  }
  else {
    ppFVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                        (&this->module_->funcs,(ulong)index);
    dollar_name.field_2._8_8_ = *ppFVar3;
    pMVar1 = this->module_;
    local_88 = this_local;
    local_80 = name_local.data_;
    name_00.size_ = dollar_name.field_2._8_8_;
    name_00.data_ = name_local.data_;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)this_local,name_00);
    GetUniqueName((string *)local_58,this,&pMVar1->func_bindings,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::operator=((string *)dollar_name.field_2._8_8_,(string *)local_58);
    pMVar1 = this->module_;
    Binding::Binding(&local_b0,index);
    std::
    unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
    ::emplace<std::__cxx11::string&,wabt::Binding>
              ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                *)&pMVar1->func_bindings,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_b0);
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
    std::__cxx11::string::~string((string *)local_58);
  }
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFunctionName(Index index, string_view name) {
  if (name.empty()) {
    return Result::Ok;
  }

  Func* func = module_->funcs[index];
  std::string dollar_name =
      GetUniqueName(&module_->func_bindings, MakeDollarName(name));
  func->name = dollar_name;
  module_->func_bindings.emplace(dollar_name, Binding(index));
  return Result::Ok;
}